

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_33ab2::
ARTCorrectnessTest_Node4ShrinkToSingleLeaf_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTCorrectnessTest_Node4ShrinkToSingleLeaf_Test
          (ARTCorrectnessTest_Node4ShrinkToSingleLeaf_Test<unodb::db<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, Node4ShrinkToSingleLeaf) {
  unodb::test::tree_verifier<TypeParam> verifier;

  verifier.insert_key_range(1, 2);

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_shrinking_inodes({0, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS

  unodb::test::must_not_allocate([&verifier] { verifier.remove(1); });

  verifier.check_present_values();
  verifier.check_absent_keys({1});

#ifdef UNODB_DETAIL_WITH_STATS
  verifier.assert_shrinking_inodes({1, 0, 0, 0});
  verifier.assert_node_counts({1, 0, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
}